

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * duckdb_fmt::v6::internal::
       parse_align<char,duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
                 *handler)

{
  bool bVar1;
  char *in_RSI;
  char *in_RDI;
  char c;
  int i;
  type align;
  align_t in_stack_ffffffffffffff7c;
  specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
  *in_stack_ffffffffffffff80;
  allocator local_51;
  string local_50 [8];
  string *in_stack_ffffffffffffffb8;
  specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *in_stack_ffffffffffffffc0;
  uint local_28;
  int local_24;
  char *local_10;
  
  local_24 = 0;
  local_28 = (uint)(in_RDI + 1 != in_RSI);
  while( true ) {
    switch(in_RDI[(int)local_28]) {
    case '<':
      local_24 = 1;
      break;
    case '=':
      local_24 = 4;
      break;
    case '>':
      local_24 = 2;
      break;
    case '^':
      local_24 = 3;
    }
    if (local_24 != 0) break;
    bVar1 = (int)local_28 < 1;
    local_28 = local_28 - 1;
    if (bVar1) {
      return in_RDI;
    }
  }
  if ((int)local_28 < 1) {
    local_10 = in_RDI + 1;
  }
  else {
    if (*in_RDI == '{') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"invalid fill character \'{\'",&local_51);
      specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
      ::on_error(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      return in_RDI;
    }
    local_10 = in_RDI + 2;
    specs_setter<char>::on_fill
              ((specs_setter<char> *)in_stack_ffffffffffffff80,
               (char)(in_stack_ffffffffffffff7c >> 0x18));
  }
  specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
  ::on_align(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  return local_10;
}

Assistant:

FMT_CONSTEXPR const Char* parse_align(const Char* begin, const Char* end,
                                      Handler&& handler) {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
#if FMT_NUMERIC_ALIGN
    case '=':
      align = align::numeric;
      break;
#endif
    case '^':
      align = align::center;
      break;
    }
    if (align != align::none) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else
        ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}